

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool __thiscall argo::json::string_equal(json *this,json *other)

{
  long lVar1;
  json_exception *this_00;
  __type _Var2;
  json *other_local;
  json *this_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    lVar1 = std::__cxx11::string::size();
    if (lVar1 == 0) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(this->m_value).u_object,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(other->m_value).u_object);
      return _Var2;
    }
  }
  this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_exception::json_exception(this_00,cant_compare_raw_e);
  __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
}

Assistant:

bool json::string_equal(const json &other) const
{
    if (m_raw_value.size() == 0 && other.m_raw_value.size() == 0)
    {
        return m_value.u_string == other.m_value.u_string;
    }
    else
    {
        throw json_exception(json_exception::cant_compare_raw_e);
    }
}